

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasLeafData(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
              *this)

{
  bool bVar1;
  long in_RDI;
  undefined1 local_9;
  
  bVar1 = Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::isSome
                    ((OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)
                     (in_RDI + 0xf0));
  local_9 = false;
  if (bVar1) {
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::operator->
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)0x3c527d);
    local_9 = Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::hasNext
                        ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)0x3c5285);
  }
  return local_9;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }